

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O2

void lts2::CreateWaveletDisplay(Mat *waves,Mat *display,int ww,int wh)

{
  uint uVar1;
  uint uVar2;
  int y;
  _InputArray *p_Var3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  Range _colRange;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double wmax;
  double wmin;
  ulong local_268;
  Range local_260;
  uint local_258;
  uint local_254;
  ulong local_250;
  ulong local_248;
  _InputArray local_240;
  ulong local_228;
  ulong local_220;
  Mat C;
  long *local_1d0;
  Mat HV;
  Mat VV;
  undefined8 local_f8;
  Mat HH;
  Mat submat;
  
  local_f8 = CONCAT44((int)**(undefined8 **)(waves + 0x40),
                      (int)((ulong)**(undefined8 **)(waves + 0x40) >> 0x20));
  cv::Mat::create(display,&local_f8,0);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&submat,0.0);
  _C = -0x3efdfffa;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)display,(_InputArray *)&C);
  uVar7 = (long)ww / 2;
  uVar4 = uVar7 & 0xffffffff;
  uVar13 = (long)wh / 2 & 0xffffffff;
  cv::Mat::Mat(&submat);
  cv::Mat::Mat(&C);
  local_268 = uVar13;
  cv::Mat::operator()(&HH,(Range)waves,(Range)(uVar13 << 0x20));
  cv::Mat::operator=(&submat,&HH);
  cv::Mat::~Mat(&HH);
  _HH = 0x1010000;
  p_Var3 = (_InputArray *)cv::noArray();
  cv::minMaxLoc((_InputArray *)&HH,&wmin,&wmax,(Point_ *)0x0,(Point_ *)0x0,p_Var3);
  _HH = 0x2010000;
  uVar13 = 0;
  cv::Mat::convertTo((_OutputArray *)&submat,(int)&HH,255.0 / (wmax - wmin),
                     (wmin * -255.0) / (wmax - wmin));
  iVar12 = (int)uVar7;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  uVar6 = local_268 & 0xffffffff;
  if ((int)local_268 < 1) {
    uVar6 = uVar13;
  }
  for (; uVar13 != uVar6; uVar13 = uVar13 + 1) {
    lVar15 = **(long **)(display + 0x48);
    lVar5 = *(long *)(display + 0x10);
    lVar14 = *local_1d0;
    for (lVar10 = 0; iVar12 != (int)lVar10; lVar10 = lVar10 + 1) {
      *(undefined1 *)(lVar15 * uVar13 + lVar5 + lVar10) =
           *(undefined1 *)(lVar14 * uVar13 + 0x400000001 + lVar10);
    }
  }
  uVar7 = uVar7 & 0xffffffff;
  uVar6 = local_268 & 0xffffffff;
  uVar13 = local_268;
  local_260 = (Range)waves;
  while( true ) {
    uVar1 = *(uint *)((long)local_260 + 0xc);
    if (((int)uVar1 / 2 < (int)uVar4) ||
       (uVar2 = *(uint *)((long)local_260 + 8), (int)uVar2 / 2 < (int)uVar13)) break;
    local_254 = (int)uVar7 + (int)uVar4;
    if ((int)local_254 <= (int)uVar1) {
      uVar1 = local_254;
    }
    local_258 = (int)uVar6 + (int)uVar13;
    if ((int)local_258 <= (int)uVar2) {
      uVar2 = local_258;
    }
    local_228 = uVar7 | (ulong)uVar1 << 0x20;
    local_268 = uVar13;
    local_250 = uVar4;
    local_248 = uVar6;
    local_220 = uVar7;
    cv::Mat::operator()(&HH,local_260,(Range)((ulong)uVar2 << 0x20));
    _VV = 0x1010000;
    p_Var3 = (_InputArray *)cv::noArray();
    cv::minMaxLoc((_InputArray *)&VV,&wmin,&wmax,(Point_ *)0x0,(Point_ *)0x0,p_Var3);
    _VV = 0x2010000;
    cv::Mat::convertTo((_OutputArray *)&HH,(int)(_InputArray *)&VV,255.0 / (wmax - wmin),
                       (wmin * -255.0) / (wmax - wmin));
    lVar15 = (long)(int)local_220;
    iVar12 = 0;
    if (0 < (int)local_250) {
      iVar12 = (int)local_250;
    }
    uVar7 = 0;
    if (0 < (int)local_268) {
      uVar7 = local_268 & 0xffffffff;
    }
    for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
      lVar5 = **(long **)(display + 0x48);
      lVar14 = *local_1d0;
      lVar10 = *(long *)(display + 0x10);
      for (lVar8 = 0; iVar12 != (int)lVar8; lVar8 = lVar8 + 1) {
        *(undefined1 *)(lVar10 + lVar15 + lVar5 * uVar4 + lVar8) =
             *(undefined1 *)(lVar14 * uVar4 + 0x400000001 + lVar8);
      }
    }
    _colRange = (Range)((ulong)uVar2 << 0x20 | local_248 & 0xffffffff);
    cv::Mat::operator()(&VV,local_260,_colRange);
    _HV = 0x1010000;
    p_Var3 = (_InputArray *)cv::noArray();
    cv::minMaxLoc((_InputArray *)&HV,&wmin,&wmax,(Point_ *)0x0,(Point_ *)0x0,p_Var3);
    _HV = 0x2010000;
    cv::Mat::convertTo((_OutputArray *)&VV,(int)(_InputArray *)&HV,255.0 / (wmax - wmin),
                       (wmin * -255.0) / (wmax - wmin));
    lVar14 = (long)(int)local_248;
    lVar5 = lVar14;
    for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
      lVar10 = *local_1d0;
      lVar8 = **(long **)(display + 0x48);
      lVar9 = *(long *)(display + 0x10);
      for (lVar11 = 0; iVar12 != (int)lVar11; lVar11 = lVar11 + 1) {
        *(undefined1 *)(lVar8 * lVar5 + lVar9 + lVar11) =
             *(undefined1 *)(lVar10 * uVar4 + 0x400000001 + lVar11);
      }
      lVar5 = lVar5 + 1;
    }
    cv::Mat::operator()(&HV,local_260,_colRange);
    local_240.sz.width = 0;
    local_240.sz.height = 0;
    local_240.flags = 0x1010000;
    local_240.obj = &HV;
    p_Var3 = (_InputArray *)cv::noArray();
    cv::minMaxLoc(&local_240,&wmin,&wmax,(Point_ *)0x0,(Point_ *)0x0,p_Var3);
    local_240.sz.width = 0;
    local_240.sz.height = 0;
    local_240.flags = 0x2010000;
    local_240.obj = &C;
    cv::Mat::convertTo((_OutputArray *)&HV,(int)&local_240,255.0 / (wmax - wmin),
                       (wmin * -255.0) / (wmax - wmin));
    for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
      lVar5 = *local_1d0;
      lVar10 = *(long *)(display + 0x10);
      lVar8 = **(long **)(display + 0x48);
      for (lVar9 = 0; iVar12 != (int)lVar9; lVar9 = lVar9 + 1) {
        *(undefined1 *)(lVar8 * lVar14 + lVar10 + lVar15 + lVar9) =
             *(undefined1 *)(lVar5 * uVar4 + 0x400000001 + lVar9);
      }
      lVar14 = lVar14 + 1;
    }
    uVar4 = (ulong)(uint)((int)local_250 * 2);
    uVar13 = (ulong)(uint)((int)local_268 * 2);
    cv::Mat::~Mat(&HV);
    cv::Mat::~Mat(&VV);
    cv::Mat::~Mat(&HH);
    uVar7 = (ulong)local_254;
    uVar6 = (ulong)local_258;
  }
  cv::Mat::~Mat(&C);
  cv::Mat::~Mat(&submat);
  return;
}

Assistant:

void lts2::CreateWaveletDisplay(const cv::Mat &waves, cv::Mat &display, int ww, int wh)
{
  display.create(waves.size(), CV_8U);
  display.setTo(cv::Scalar(0));
    
  // Find the continuous part first
  int subWindowWidth = ww / 2;
  int subWindowHeight = wh / 2;

  cv::Mat submat;
    
  cv::Mat C;
  submat = waves(cv::Range(0, subWindowHeight), cv::Range(0, subWindowWidth));
    
  double wmin, wmax, wrange;
  cv::minMaxLoc(submat, &wmin, &wmax);
  wrange = wmax - wmin;
    
  submat.convertTo(C, CV_8UC1, 255.0/wrange, -255.0f*wmin/wrange);
    
  for (int y = 0; y < subWindowHeight; ++y)
  {
    const uchar* srcptr = C.ptr<uchar>(y);
    uchar* destptr = display.ptr<uchar>(y);
        
    for (int x = 0; x < subWindowWidth; ++x)
      *destptr++ = *srcptr++;
  }
    
  // Now for the diff images
  int offsetX = subWindowWidth;
  int offsetY = subWindowHeight;
    
  while (subWindowWidth <= waves.cols/2 && subWindowHeight <= waves.rows/2) 
  {
    int maxX = MIN(waves.cols, offsetX + subWindowWidth);
    int maxY = MIN(waves.rows, offsetY + subWindowHeight);
        
    // HH
    cv::Mat HH = waves(cv::Range(0, maxY), cv::Range(offsetX, maxX));
    cv::minMaxLoc(HH, &wmin, &wmax);
    wrange = wmax - wmin;
    HH.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y) + offsetX;
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }

    // VV
    cv::Mat VV = waves(cv::Range(offsetY, maxY), cv::Range(0, maxX));
    cv::minMaxLoc(VV, &wmin, &wmax);
    wrange = wmax - wmin;
    VV.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y+offsetY);
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }
        
    // HV
    cv::Mat HV = waves(cv::Range(offsetY, maxY), cv::Range(offsetX, maxX));
    cv::minMaxLoc(HV, &wmin, &wmax);
    wrange = wmax - wmin;
    HV.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y+offsetY) + offsetX;
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }
        
    // Update the bounds
    offsetX += subWindowWidth;
    offsetY += subWindowHeight;
    subWindowWidth *= 2;
    subWindowHeight *= 2;
  }
}